

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
Expand<unsigned_long>
          (Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this,size_t count)

{
  ulong uVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_00;
  char *pcVar2;
  size_t originalSize;
  long lVar3;
  ulong newSize;
  
  pcVar2 = this->stack_;
  if (pcVar2 == (char *)0x0) {
    this_00 = this->allocator_;
    if (this_00 == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
      this_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x18);
      MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
                (this_00,0x10000,(CrtAllocator *)0x0);
      this->allocator_ = this_00;
      this->ownAllocator_ = this_00;
      pcVar2 = this->stack_;
    }
    else {
      pcVar2 = (char *)0x0;
    }
    uVar1 = this->initialCapacity_;
    originalSize = (long)this->stackEnd_ - (long)pcVar2;
  }
  else {
    this_00 = this->allocator_;
    originalSize = (long)this->stackEnd_ - (long)pcVar2;
    uVar1 = (originalSize + 1 >> 1) + originalSize;
  }
  lVar3 = (long)this->stackTop_ - (long)pcVar2;
  newSize = lVar3 + count * 8;
  if (newSize < uVar1) {
    newSize = uVar1;
  }
  pcVar2 = (char *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                             (this_00,pcVar2,originalSize,newSize);
  this->stack_ = pcVar2;
  this->stackTop_ = pcVar2 + lVar3;
  this->stackEnd_ = pcVar2 + newSize;
  return;
}

Assistant:

void Expand(size_t count) {
        // Only expand the capacity if the current stack exists. Otherwise just create a stack with initial capacity.
        size_t newCapacity;
        if (stack_ == 0) {
            if (!allocator_)
                ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
            newCapacity = initialCapacity_;
        } else {
            newCapacity = GetCapacity();
            newCapacity += (newCapacity + 1) / 2;
        }
        size_t newSize = GetSize() + sizeof(T) * count;
        if (newCapacity < newSize)
            newCapacity = newSize;

        Resize(newCapacity);
    }